

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O1

void fmt::v7::detail::format_value<char,diy::Point<float,3u>>
               (buffer<char> *buf,Point<float,_3U> *value,locale_ref loc)

{
  long lVar1;
  ulong uVar2;
  formatbuf<char> format_buf;
  basic_ostream<char,_std::char_traits<char>_> output;
  locale alStack_198 [8];
  locale local_190 [8];
  undefined **local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  locale local_150 [8];
  buffer<char> *local_148;
  long local_140;
  ios_base local_138 [20];
  undefined4 auStack_124 [61];
  
  local_188 = (undefined **)&ompi_mpi_unsigned;
  local_180 = 0;
  uStack_178 = 0;
  local_170 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_158 = 0;
  std::locale::locale(local_150);
  local_188 = &PTR__streambuf_0014dc38;
  local_148 = buf;
  std::ostream::ostream(&local_140,(streambuf *)&local_188);
  if (loc.locale_ != (void *)0x0) {
    std::locale::locale(alStack_198,(locale *)loc.locale_);
    std::ios::imbue(local_190);
    std::locale::~locale(local_190);
    std::locale::~locale(alStack_198);
  }
  diy::Point<float,_3U>::operator<<(value,(ostream *)&local_140);
  lVar1 = *(long *)(local_140 + -0x18);
  *(undefined4 *)((long)auStack_124 + lVar1) = 5;
  std::ios::clear((int)alStack_198 + (int)lVar1 + 0x58);
  uVar2 = buf->size_;
  if (buf->capacity_ < uVar2) {
    (**buf->_vptr_buffer)(buf,uVar2);
  }
  if (buf->capacity_ < uVar2) {
    uVar2 = buf->capacity_;
  }
  buf->size_ = uVar2;
  std::ios_base::~ios_base(local_138);
  local_188 = (undefined **)&ompi_mpi_unsigned;
  std::locale::~locale(local_150);
  return;
}

Assistant:

void format_value(buffer<Char>& buf, const T& value,
                  locale_ref loc = locale_ref()) {
  formatbuf<Char> format_buf(buf);
  std::basic_ostream<Char> output(&format_buf);
#if !defined(FMT_STATIC_THOUSANDS_SEPARATOR)
  if (loc) output.imbue(loc.get<std::locale>());
#endif
  output << value;
  output.exceptions(std::ios_base::failbit | std::ios_base::badbit);
  buf.try_resize(buf.size());
}